

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

char * choc::text::FloatToStringBuffer<double>::writeWithoutExponentGreaterThan1
                 (char *dest,uint32_t totalLength,uint32_t mantissaLength,int maxDecimalPlaces,int K
                 )

{
  long lVar1;
  char *pcVar2;
  
  if (K < 0) {
    memmove(dest + mantissaLength + 1,dest + mantissaLength,(ulong)(totalLength - mantissaLength));
    dest[mantissaLength] = '.';
    if (K + maxDecimalPlaces < 0) {
      if ((int)(mantissaLength + 1) < (int)(maxDecimalPlaces + mantissaLength)) {
        lVar1 = (long)(int)(maxDecimalPlaces + mantissaLength);
        pcVar2 = dest + lVar1 + 1;
        do {
          if (pcVar2[-1] != '0') {
            return pcVar2;
          }
          lVar1 = lVar1 + -1;
          pcVar2 = pcVar2 + -1;
        } while ((int)(mantissaLength + 1) < lVar1);
      }
      pcVar2 = dest + (mantissaLength + 2);
    }
    else {
      pcVar2 = dest + (totalLength + 1);
    }
  }
  else {
    pcVar2 = dest + totalLength;
    if (totalLength < mantissaLength) {
      memset(pcVar2,0x30,(ulong)(~totalLength + mantissaLength) + 1);
      pcVar2 = pcVar2 + (ulong)(~totalLength + mantissaLength) + 1;
    }
    pcVar2[0] = '.';
    pcVar2[1] = '0';
    pcVar2 = pcVar2 + 2;
  }
  return pcVar2;
}

Assistant:

static char* writeWithoutExponentGreaterThan1 (char* dest, uint32_t totalLength, uint32_t mantissaLength, int maxDecimalPlaces, int K)
    {
        if (K >= 0)
        {
            dest += totalLength;

            for (auto i = totalLength; i < mantissaLength; ++i)
                dest = write (dest, '0');

            return write (dest, '.', '0');
        }

        insertChar (dest + mantissaLength, totalLength - mantissaLength, '.', 1);

        if (K + maxDecimalPlaces >= 0)
            return dest + (totalLength + 1);

        for (auto i = static_cast<int> (mantissaLength) + maxDecimalPlaces; i > static_cast<int> (mantissaLength + 1); --i)
            if (dest[i] != '0')
                return dest + (i + 1);

        return dest + (mantissaLength + 2);
    }